

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

void __thiscall
Clasp::DefaultUnfoundedCheck::removeSource(DefaultUnfoundedCheck *this,NodeId bodyId)

{
  AtomData AVar1;
  pointer pBVar2;
  pointer pAVar3;
  NodeId *pNVar4;
  int iVar5;
  uint at;
  NodeId *x;
  
  pBVar2 = (this->graph_->bodies_).ebo_.buf;
  x = pBVar2[bodyId].super_Node.adj_;
  pNVar4 = pBVar2[bodyId].super_Node.sep_;
  iVar5 = *(int *)&pBVar2[bodyId].super_Node.field_0x4;
  if (x != pNVar4 + (iVar5 * 8 >> 0x1f)) {
    do {
      at = *x;
      pAVar3 = (this->atoms_).ebo_.buf;
      AVar1 = pAVar3[at];
      if (((uint)AVar1 & 0x1fffffff) == bodyId) {
        if ((int)AVar1 < 0) {
          pAVar3[at] = (AtomData)((uint)AVar1 & 0x7fffffff);
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->sourceQ_,x);
          at = *x;
        }
        pushTodo(this,at);
        pNVar4 = pBVar2[bodyId].super_Node.sep_;
        iVar5 = *(int *)&pBVar2[bodyId].super_Node.field_0x4;
      }
      x = x + 1;
    } while (x != pNVar4 + (iVar5 * 8 >> 0x1f));
  }
  propagateSource(this);
  return;
}

Assistant:

void DefaultUnfoundedCheck::removeSource(NodeId bodyId) {
	const BodyNode& body = graph_->getBody(bodyId);
	for (const NodeId* x = body.heads_begin(); x != body.heads_end(); ++x) {
		if (atoms_[*x].watch() == bodyId) {
			if (atoms_[*x].hasSource()) {
				atoms_[*x].markSourceInvalid();
				sourceQ_.push_back(*x);
			}
			pushTodo(*x);
		}
	}
	propagateSource();
}